

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flatbuffer_builder.h
# Opt level: O3

uint __thiscall
flatbuffers::FlatBufferBuilderImpl<false>::PushElement<long,unsigned_int>
          (FlatBufferBuilderImpl<false> *this,long element)

{
  uint8_t *puVar1;
  uint uVar2;
  
  if (this->minalign_ < 8) {
    this->minalign_ = 8;
  }
  vector_downward<unsigned_int>::fill(&this->buf_,(ulong)(-(this->buf_).size_ & 7));
  vector_downward<unsigned_int>::ensure_space(&this->buf_,8);
  puVar1 = (this->buf_).cur_;
  (this->buf_).cur_ = puVar1 + -8;
  uVar2 = (this->buf_).size_ + 8;
  (this->buf_).size_ = uVar2;
  *(long *)(puVar1 + -8) = element;
  return uVar2;
}

Assistant:

ReturnT PushElement(T element) {
    AssertScalarT<T>();
    Align(sizeof(T));
    buf_.push_small(EndianScalar(element));
    return CalculateOffset<ReturnT>();
  }